

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime.c
# Opt level: O1

void * helper_lookup_tb_ptr_mipsel(CPUArchState_conflict8 *env)

{
  uint pc;
  long lVar1;
  long lVar2;
  TranslationBlock_conflict *pTVar3;
  uint flags;
  uint32_t cf_mask;
  uint uVar4;
  ulong uVar5;
  TranslationBlock_conflict *pTVar6;
  tb_tc *ptVar7;
  
  lVar1 = *(long *)(env[-1].tcs[0xc].gpr + 8);
  lVar2 = *(long *)(env[-4].tcs[0xe].gpr + 4);
  pc = *(uint *)(lVar2 + 0x80);
  flags = *(uint *)(lVar2 + 0x2b94) & 0x1fffffff;
  uVar4 = pc >> 6 ^ pc;
  uVar5 = (ulong)(uVar4 & 0x3f | uVar4 >> 6 & 0xfc0);
  pTVar6 = *(TranslationBlock_conflict **)((long)env + uVar5 * 8 + -0x8bb8);
  cf_mask = env[-1].tcs[0xc].gpr[3] << 0x18;
  if ((((pTVar6 == (TranslationBlock_conflict *)0x0) || (pTVar6->pc != pc)) ||
      (pTVar6->cs_base != 0)) ||
     (((pTVar6->flags != flags ||
       (*(ulong *)env[-1].tcs[0xc].gpr != (ulong)pTVar6->trace_vcpu_dstate)) ||
      ((pTVar6->cflags & 0xff0effff) != cf_mask)))) {
    pTVar3 = tb_htable_lookup_mipsel((CPUState *)(env[-4].tcs[0xd].mmr + 5),pc,0,flags,cf_mask);
    pTVar6 = (TranslationBlock_conflict *)0x0;
    if (pTVar3 != (TranslationBlock_conflict *)0x0) {
      *(TranslationBlock_conflict **)((long)env + uVar5 * 8 + -0x8bb8) = pTVar3;
      pTVar6 = pTVar3;
    }
  }
  if (pTVar6 == (TranslationBlock_conflict *)0x0) {
    ptVar7 = (tb_tc *)(*(long *)(lVar1 + 0x2e8) + 0x98);
  }
  else {
    ptVar7 = &pTVar6->tc;
  }
  return ptVar7->ptr;
}

Assistant:

void *HELPER(lookup_tb_ptr)(CPUArchState *env)
{
    CPUState *cpu = env_cpu(env);
    TranslationBlock *tb;
    target_ulong cs_base, pc;
    uint32_t flags;
    struct uc_struct *uc = (struct uc_struct *)cpu->uc;

    tb = tb_lookup__cpu_state(cpu, &pc, &cs_base, &flags, curr_cflags());
    if (tb == NULL) {
        return uc->tcg_ctx->code_gen_epilogue;
    }
    return tb->tc.ptr;
}